

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O2

int64_t pick_intra_angle_routine_sbuv
                  (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int rate_overhead,int64_t best_rd_in
                  ,int *rate,RD_STATS *rd_stats,int *best_angle_delta,int64_t *best_rd)

{
  MB_MODE_INFO *mbmi;
  int iVar1;
  int64_t iVar2;
  long lVar3;
  RD_STATS local_58;
  
  mbmi = *(x->e_mbd).mi;
  iVar1 = av1_txfm_uvrd(cpi,x,&local_58,bsize,best_rd_in);
  if (iVar1 == 0) {
    iVar2 = 0x7fffffffffffffff;
  }
  else {
    lVar3 = (long)local_58.rate;
    iVar1 = intra_mode_info_cost_uv(cpi,x,mbmi,bsize,rate_overhead);
    iVar2 = local_58.dist * 0x80 + ((long)x->rdmult * (iVar1 + lVar3) + 0x100 >> 9);
    if (iVar2 < *best_rd) {
      *best_rd = iVar2;
      *best_angle_delta = (int)mbmi->angle_delta[1];
      *rate = (int)(iVar1 + lVar3);
      rd_stats->rate = local_58.rate;
      rd_stats->dist = local_58.dist;
      rd_stats->skip_txfm = local_58.skip_txfm;
    }
  }
  return iVar2;
}

Assistant:

static int64_t pick_intra_angle_routine_sbuv(
    const AV1_COMP *const cpi, MACROBLOCK *x, BLOCK_SIZE bsize,
    int rate_overhead, int64_t best_rd_in, int *rate, RD_STATS *rd_stats,
    int *best_angle_delta, int64_t *best_rd) {
  MB_MODE_INFO *mbmi = x->e_mbd.mi[0];
  assert(!is_inter_block(mbmi));
  int this_rate;
  int64_t this_rd;
  RD_STATS tokenonly_rd_stats;

  if (!av1_txfm_uvrd(cpi, x, &tokenonly_rd_stats, bsize, best_rd_in))
    return INT64_MAX;
  this_rate = tokenonly_rd_stats.rate +
              intra_mode_info_cost_uv(cpi, x, mbmi, bsize, rate_overhead);
  this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);
  if (this_rd < *best_rd) {
    *best_rd = this_rd;
    *best_angle_delta = mbmi->angle_delta[PLANE_TYPE_UV];
    *rate = this_rate;
    rd_stats->rate = tokenonly_rd_stats.rate;
    rd_stats->dist = tokenonly_rd_stats.dist;
    rd_stats->skip_txfm = tokenonly_rd_stats.skip_txfm;
  }
  return this_rd;
}